

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *
readFile(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *__return_storage_ptr__,string *file)

{
  char cVar1;
  string res;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  ifstream in;
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&in,(string *)file,_S_in);
  std::__cxx11::string::string<std::allocator<char>>((string *)&res,"",(allocator<char> *)local_240)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)local_240,*(undefined8 *)((long)auStack_138 + *(long *)(_in + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    std::__cxx11::string::operator=((string *)&res,(string *)local_240);
    std::__cxx11::string::~string((string *)local_240);
  }
  std::ifstream::close();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&res);
  __return_storage_ptr__->second = cVar1 != '\0';
  std::__cxx11::string::~string((string *)&res);
  std::ifstream::~ifstream(&in);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, bool> readFile(const std::string& file)
{
	std::ifstream in(file);
	std::string res = "";
	bool exists = false;
	if (in.is_open())
	{
		exists = true;
		res = { std::istreambuf_iterator<char>(in), std::istreambuf_iterator<char>() };
	}
    in.close();
	return std::make_pair(res, exists);
}